

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_00;
  size_type sVar1;
  LogMessage *other;
  reference this_01;
  int local_64;
  LogFinisher local_5d;
  int n;
  byte local_49;
  LogMessage local_48;
  UnknownFieldSet *local_10;
  UnknownFieldSet *this_local;
  
  local_49 = 0;
  local_10 = this;
  if ((this->fields_ ==
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0) || (sVar1 = std::
                        vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        ::size(this->fields_), sVar1 == 0)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x4a);
    local_49 = 1;
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: fields_ != NULL && fields_->size() > 0: ");
    internal::LogFinisher::operator=(&local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  sVar1 = std::
          vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
          size(this->fields_);
  local_64 = (int)sVar1;
  do {
    local_64 = local_64 + -1;
    this_01 = std::
              vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ::operator[](this->fields_,(long)local_64);
    UnknownField::Delete(this_01);
  } while (0 < local_64);
  this_00 = this->fields_;
  if (this_00 !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    ~vector(this_00);
    operator_delete(this_00,0x18);
  }
  this->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  GOOGLE_DCHECK(fields_ != NULL && fields_->size() > 0);
  int n = fields_->size();
  do {
    (*fields_)[--n].Delete();
  } while (n > 0);
  delete fields_;
  fields_ = NULL;
}